

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O2

QNetworkInformation * __thiscall
QNetworkInformationPrivate::create(QNetworkInformationPrivate *this,QStringView name)

{
  QNetworkInformationBackendFactory *pQVar1;
  bool bVar2;
  undefined4 uVar3;
  Type *pTVar4;
  QNetworkInformationBackend *backend;
  QNetworkInformation *this_00;
  QNetworkInformation *pQVar5;
  const_iterator __it;
  long lVar6;
  long lVar7;
  QNetworkInformationBackendFactory **ppQVar8;
  const_iterator cVar9;
  long in_FS_OFFSET;
  QNetworkInformationPrivate *local_58;
  qsizetype local_50;
  undefined1 local_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this == (QNetworkInformationPrivate *)0x0) ||
      (pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
                operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>
                            *)this), pTVar4 == (Type *)0x0)) || (bVar2 = initializeList(), !bVar2))
  {
    pQVar5 = (QNetworkInformation *)0x0;
    goto LAB_001a8d4f;
  }
  local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::instance
                     ();
  QMutexLocker<QMutex>::QMutexLocker((QMutexLocker<QMutex> *)local_48,&pTVar4->instanceMutex);
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::instance
                     ();
  pQVar5 = (pTVar4->instanceHolder)._M_t.
           super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
           super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
           super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl;
  pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::instance
                     ();
  if (pQVar5 == (QNetworkInformation *)0x0) {
    __it.i = (pTVar4->factories).d.ptr;
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
             instance();
    ppQVar8 = (pTVar4->factories).d.ptr + (pTVar4->factories).d.size;
    lVar7 = (long)ppQVar8 - (long)__it.i;
    local_58 = this;
    local_50 = name.m_size;
    for (lVar6 = lVar7 >> 5; 0 < lVar6; lVar6 = lVar6 + -1) {
      bVar2 = __gnu_cxx::__ops::_Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::
              operator()((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                         &local_58,__it);
      cVar9.i = __it.i;
      if (bVar2) goto LAB_001a8e58;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::
              operator()((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                         &local_58,(const_iterator)(__it.i + 1));
      cVar9.i = __it.i + 1;
      if (bVar2) goto LAB_001a8e58;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::
              operator()((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                         &local_58,(const_iterator)(__it.i + 2));
      cVar9.i = __it.i + 2;
      if (bVar2) goto LAB_001a8e58;
      bVar2 = __gnu_cxx::__ops::_Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::
              operator()((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                         &local_58,(const_iterator)(__it.i + 3));
      cVar9.i = __it.i + 3;
      if (bVar2) goto LAB_001a8e58;
      __it.i = __it.i + 4;
      lVar7 = lVar7 + -0x20;
    }
    lVar7 = lVar7 >> 3;
    if (lVar7 == 1) {
LAB_001a8e44:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::
              operator()((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                         &local_58,__it);
      cVar9.i = ppQVar8;
      if (bVar2) {
        cVar9.i = __it.i;
      }
    }
    else if (lVar7 == 2) {
LAB_001a8e2c:
      bVar2 = __gnu_cxx::__ops::_Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>::
              operator()((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                         &local_58,__it);
      cVar9.i = __it.i;
      if (!bVar2) {
        __it.i = __it.i + 1;
        goto LAB_001a8e44;
      }
    }
    else {
      cVar9.i = ppQVar8;
      if ((lVar7 == 3) &&
         (bVar2 = __gnu_cxx::__ops::_Iter_pred<QNetworkInformationPrivate::create(QStringView)::$_0>
                  ::operator()((_Iter_pred<QNetworkInformationPrivate::create(QStringView)::__0> *)
                               &local_58,__it), cVar9.i = __it.i, !bVar2)) {
        __it.i = __it.i + 1;
        goto LAB_001a8e2c;
      }
    }
LAB_001a8e58:
    pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
             instance();
    if (cVar9.i != (pTVar4->factories).d.ptr + (pTVar4->factories).d.size) {
      pQVar1 = *cVar9.i;
      uVar3 = (**(code **)(*(long *)pQVar1 + 0x70))(pQVar1);
      backend = (QNetworkInformationBackend *)(**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,uVar3);
      if (backend != (QNetworkInformationBackend *)0x0) {
        pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
                 instance();
        this_00 = (QNetworkInformation *)operator_new(0x10);
        QNetworkInformation::QNetworkInformation(this_00,backend);
        pQVar5 = (pTVar4->instanceHolder)._M_t.
                 super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
                 super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
                 super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl;
        (pTVar4->instanceHolder)._M_t.
        super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
        super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
        super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl =
             (QNetworkInformation *)this_00;
        if (pQVar5 != (QNetworkInformation *)0x0) {
          (**(code **)(*(long *)pQVar5 + 0x20))();
        }
        pTVar4 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_dataHolder>_>::
                 instance();
        goto LAB_001a8d44;
      }
    }
    pQVar5 = (QNetworkInformation *)0x0;
  }
  else {
LAB_001a8d44:
    pQVar5 = (pTVar4->instanceHolder)._M_t.
             super___uniq_ptr_impl<QNetworkInformation,_QNetworkInformationDeleter>._M_t.
             super__Tuple_impl<0UL,_QNetworkInformation_*,_QNetworkInformationDeleter>.
             super__Head_base<0UL,_QNetworkInformation_*,_false>._M_head_impl;
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)local_48);
LAB_001a8d4f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pQVar5;
}

Assistant:

QNetworkInformation *QNetworkInformationPrivate::create(QStringView name)
{
    if (name.isEmpty())
        return nullptr;
    if (!dataHolder())
        return nullptr;
#ifdef DEBUG_LOADING
    qDebug().nospace() << "create() called with name=\"" << name
                       << "\". instanceHolder initialized? " << !!dataHolder->instanceHolder;
#endif
    if (!initializeList()) {
#ifdef DEBUG_LOADING
        qDebug("Failed to initialize list, returning.");
#endif
        return nullptr;
    }

    QMutexLocker locker(&dataHolder->instanceMutex);
    if (dataHolder->instanceHolder)
        return dataHolder->instanceHolder.get();


    const auto nameMatches = [name](QNetworkInformationBackendFactory *factory) {
        return factory->name().compare(name, Qt::CaseInsensitive) == 0;
    };
    auto it = std::find_if(dataHolder->factories.cbegin(), dataHolder->factories.cend(),
                            nameMatches);
    if (it == dataHolder->factories.cend()) {
#ifdef DEBUG_LOADING
        if (dataHolder->factories.isEmpty()) {
            qDebug("No plugins available");
        } else {
            QString listNames;
            listNames.reserve(8 * dataHolder->factories.count());
            for (const auto *factory : std::as_const(dataHolder->factories))
                listNames += factory->name() + ", "_L1;
            listNames.chop(2);
            qDebug().nospace() << "Couldn't find " << name << " in list with names: { "
                                << listNames << " }";
        }
#endif
        return nullptr;
    }
#ifdef DEBUG_LOADING
    qDebug() << "Creating instance using loader named " << (*it)->name();
#endif
    QNetworkInformationBackend *backend = (*it)->create((*it)->featuresSupported());
    if (!backend)
        return nullptr;
    dataHolder->instanceHolder.reset(new QNetworkInformation(backend));
    Q_ASSERT(name.isEmpty()
             || dataHolder->instanceHolder->backendName().compare(name, Qt::CaseInsensitive) == 0);
    return dataHolder->instanceHolder.get();
}